

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
          (EpsCopyOutputStream *this,uint32_t num,string_view s,uint8_t *ptr)

{
  ulong uVar1;
  byte *pbVar2;
  uint8_t *puVar3;
  uint uVar4;
  uint size;
  
  pbVar2 = this->end_;
  if (pbVar2 <= ptr) {
    ptr = EnsureSpaceFallback(this,ptr);
    pbVar2 = this->end_;
  }
  size = (uint)s._M_len;
  if (ptr < pbVar2) {
    uVar1 = (ulong)(num * 8 + 2);
    if (0x7f < num << 3) {
      do {
        uVar4 = (uint)uVar1;
        *ptr = (byte)uVar1 | 0x80;
        uVar1 = uVar1 >> 7;
        ptr = ptr + 1;
      } while (0x3fff < uVar4);
    }
    *ptr = (byte)uVar1;
    pbVar2 = ptr + 1;
    uVar1 = s._M_len & 0xffffffff;
    if (0x7f < size) {
      do {
        ptr = pbVar2;
        uVar4 = (uint)uVar1;
        *ptr = (byte)uVar1 | 0x80;
        uVar1 = uVar1 >> 7;
        pbVar2 = ptr + 1;
      } while (0x3fff < uVar4);
    }
    ptr = ptr + 2;
    *pbVar2 = (byte)uVar1;
    if ((long)(int)size <= (long)this->end_ - (long)ptr) {
      memcpy(ptr,s._M_str,s._M_len & 0xffffffff);
      return ptr + (int)size;
    }
  }
  else {
    WriteStringOutline((EpsCopyOutputStream *)&stack0xffffffffffffffc8);
  }
  puVar3 = WriteRawFallback(this,s._M_str,size,ptr);
  return puVar3;
}

Assistant:

uint8_t* EpsCopyOutputStream::WriteStringOutline(uint32_t num,
                                                 absl::string_view s,
                                                 uint8_t* ptr) {
  ptr = EnsureSpace(ptr);
  uint32_t size = s.size();
  ptr = WriteLengthDelim(num, size, ptr);
  return WriteRaw(s.data(), size, ptr);
}